

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

tmbstr ParseAttribute(TidyDocImpl *doc,Bool *isempty,Node **asp,Node **php)

{
  Lexer *lexer_00;
  uint uVar1;
  Bool BVar2;
  uint uVar3;
  Node *pNVar4;
  tmbstr local_58;
  uint local_50;
  uint local_4c;
  uint lastc;
  uint c;
  tmbstr attr;
  int len;
  int start;
  Lexer *lexer;
  Node **php_local;
  Node **asp_local;
  Bool *isempty_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  *asp = (Node *)0x0;
  *php = (Node *)0x0;
  do {
    while( true ) {
      while( true ) {
        local_4c = prvTidyReadChar(doc->docIn);
        if (local_4c == 0x2f) {
          uVar1 = prvTidyReadChar(doc->docIn);
          if (uVar1 == 0x3e) {
            *isempty = yes;
            return (tmbstr)0x0;
          }
          prvTidyUngetChar(uVar1,doc->docIn);
          local_4c = 0x2f;
          goto LAB_00158462;
        }
        if (local_4c == 0x3e) {
          return (tmbstr)0x0;
        }
        if (local_4c == 0x3c) {
          uVar1 = prvTidyReadChar(doc->docIn);
          if (uVar1 == 0x25) {
            pNVar4 = ParseAsp(doc);
            *asp = pNVar4;
            return (tmbstr)0x0;
          }
          if (uVar1 == 0x3f) {
            pNVar4 = ParsePhp(doc);
            *php = pNVar4;
            return (tmbstr)0x0;
          }
          prvTidyUngetChar(uVar1,doc->docIn);
          prvTidyUngetChar(0x3c,doc->docIn);
          prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
          return (tmbstr)0x0;
        }
        if (local_4c != 0x3d) break;
        prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x288);
      }
      if ((local_4c != 0x22) && (local_4c != 0x27)) break;
      prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x28a);
    }
    if (local_4c == 0xffffffff) {
      prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
      prvTidyUngetChar(0xffffffff,doc->docIn);
      return (tmbstr)0x0;
    }
    BVar2 = prvTidyIsWhite(local_4c);
  } while (BVar2 != no);
LAB_00158462:
  uVar1 = lexer_00->lexsize;
  local_50 = local_4c;
  do {
    if ((local_4c == 0x3d) || (local_4c == 0x3e)) {
      prvTidyUngetChar(local_4c,doc->docIn);
LAB_001585be:
      uVar3 = lexer_00->lexsize - uVar1;
      if ((int)uVar3 < 1) {
        local_58 = (tmbstr)0x0;
      }
      else {
        local_58 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)uVar1,uVar3);
      }
      lexer_00->lexsize = uVar1;
      return local_58;
    }
    if ((local_4c == 0x3c) || (local_4c == 0xffffffff)) {
      prvTidyUngetChar(local_4c,doc->docIn);
      goto LAB_001585be;
    }
    if ((local_50 == 0x2d) && ((local_4c == 0x22 || (local_4c == 0x27)))) {
      lexer_00->lexsize = lexer_00->lexsize - 1;
      prvTidyUngetChar(local_4c,doc->docIn);
      goto LAB_001585be;
    }
    BVar2 = prvTidyIsWhite(local_4c);
    if (BVar2 != no) goto LAB_001585be;
    if (local_4c == 0x2f) {
      uVar3 = prvTidyReadChar(doc->docIn);
      if (uVar3 == 0x3e) {
        prvTidyUngetChar(0x3e,doc->docIn);
        goto LAB_001585be;
      }
      prvTidyUngetChar(uVar3,doc->docIn);
      local_4c = 0x2f;
    }
    if ((((doc->config).value[0x54].v != 2) && ((int)(doc->config).value[0x67].v == 0)) &&
       (BVar2 = prvTidyIsUpper(local_4c), BVar2 != no)) {
      local_4c = prvTidyToLower(local_4c);
    }
    prvTidyAddCharToLexer(lexer_00,local_4c);
    local_50 = local_4c;
    local_4c = prvTidyReadChar(doc->docIn);
  } while( true );
}

Assistant:

static tmbstr  ParseAttribute( TidyDocImpl* doc, Bool *isempty,
                              Node **asp, Node **php )
{
    Lexer* lexer = doc->lexer;
    int start, len = 0;
    tmbstr attr = NULL;
    uint c, lastc;

    *asp = NULL;  /* clear asp pointer */
    *php = NULL;  /* clear php pointer */

 /* skip white space before the attribute */

    for (;;)
    {
        c = TY_(ReadChar)( doc->docIn );


        if (c == '/')
        {
            c = TY_(ReadChar)( doc->docIn );

            if (c == '>')
            {
                *isempty = yes;
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            c = '/';
            break;
        }

        if (c == '>')
            return NULL;

        if (c =='<')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c == '%')
            {
                *asp = ParseAsp( doc );
                return NULL;
            }
            else if (c == '?')
            {
                *php = ParsePhp( doc );
                return NULL;
            }

            TY_(UngetChar)(c, doc->docIn);
            TY_(UngetChar)('<', doc->docIn);
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
            return NULL;
        }

        if (c == '=')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_EQUALSIGN );
            continue;
        }

        if (c == '"' || c == '\'')
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_QUOTEMARK );
            continue;
        }

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            return NULL;
        }


        if (!TY_(IsWhite)(c))
           break;
    }

    start = lexer->lexsize;
    lastc = c;

    for (;;)
    {
     /* but push back '=' for parseValue() */
        if (c == '=' || c == '>')
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (c == '<' || c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (lastc == '-' && (c == '"' || c == '\''))
        {
            lexer->lexsize--;
            --len;
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (TY_(IsWhite)(c))
            break;

        if (c == '/') /* Issue #395 - potential self closing tag */
        {
            c = TY_(ReadChar)(doc->docIn);  /* read next */
            if (c == '>')
            {
                /* got a self closing tag - put is back and continue... */
                TY_(UngetChar)(c, doc->docIn);
                break;
            }
            else
            {
                /* Not '/>' - put it back */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';  /* retore original char */
            }
        }

        /* what should be done about non-namechar characters? */
        /* currently these are incorporated into the attr name */

        if ( cfg(doc, TidyUpperCaseAttrs) != TidyUppercasePreserve )
        {
            if ( !cfgBool(doc, TidyXmlTags) && TY_(IsUpper)(c) )
                c = TY_(ToLower)(c);
        }

        TY_(AddCharToLexer)( lexer, c );
        lastc = c;
        c = TY_(ReadChar)(doc->docIn);
    }

    /* handle attribute names with multibyte chars */
    len = lexer->lexsize - start;
    attr = (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                      lexer->lexbuf+start, len) : NULL);
    lexer->lexsize = start;
    return attr;
}